

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall smf::MidiMessage::makePitchBend(MidiMessage *this,int channel,int value)

{
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  uStack_28 = CONCAT17((char)channel,(undefined7)uStack_28) | 0xe000000000000000;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)((long)&uStack_28 + 7));
  uStack_28 = CONCAT17(uStack_28._7_1_,CONCAT16((char)value,(undefined6)uStack_28)) &
              0xff7fffffffffffff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)((long)&uStack_28 + 6));
  uStack_28 = CONCAT26(uStack_28._6_2_,CONCAT15((char)((uint)value >> 7),(undefined5)uStack_28)) &
              0xffff7fffffffffff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)((long)&uStack_28 + 5));
  return;
}

Assistant:

void MidiMessage::makePitchBend(int channel, int value) {
	resize(0);
	int lsb = value & 0x7f;
	int msb = (value >> 7) & 0x7f;
	push_back(0xe0 | (0x7f & channel));
	push_back(lsb);
	push_back(msb);
}